

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleAssign
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,TIntermTyped *left,
          TIntermTyped *right)

{
  TIntermediate *pTVar1;
  TSpirvType *base;
  TVector<glslang::TVariable_*> *left_00;
  bool bVar2;
  int iVar3;
  TOperator TVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HlslParseContext *pHVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermConstantUnion *index;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar9;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  pointer ppVar10;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TQualifier *this_01;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long *plVar11;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TIntermTyped *pTVar12;
  TType *type;
  undefined4 extraout_var_23;
  longlong lVar13;
  TVariable *pTVar14;
  undefined4 extraout_var_24;
  TIntermSymbol *local_3a0;
  TIntermSymbol *local_398;
  TIntermTyped *local_360;
  bool local_352;
  bool local_351;
  TIntermSymbol *symNode_1;
  TType derefType_1;
  TIntermTyped *splitLeftNonIo;
  TIntermSymbol *symNode;
  TIntermTyped *splitRight;
  TIntermTyped *splitLeft;
  HlslParseContext *local_280;
  TStorageQualifier *local_278;
  bool *local_270;
  TStorageQualifier *local_268;
  bool *local_260;
  bool *local_258;
  vector<int,_std::allocator<int>_> *local_250;
  anon_class_104_13_1d5e7770 *local_248;
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  *local_240;
  TIntermAggregate **local_238;
  TOperator *local_230;
  TSourceLoc *local_228;
  anon_class_8_1_8991fb9c *local_220;
  undefined1 local_218 [8];
  function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
  traverse;
  anon_class_104_13_1d5e7770 getMember;
  int rightOffset;
  int leftOffset;
  int rightOffsetStart;
  int leftOffsetStart;
  TStorageQualifier rightStorage;
  TStorageQualifier leftStorage;
  vector<int,_std::allocator<int>_> arrayElement;
  TIntermTyped *noFlattenRHS;
  _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_> local_150;
  key_type_conflict2 local_148;
  _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_> local_140;
  int local_134;
  TIntermSymbol *pTStack_130;
  int memberCount;
  TIntermSymbol *cloneSymNode;
  TVariable *rhsTempVar;
  TVector<glslang::TVariable_*> *rightVariables;
  TVector<glslang::TVariable_*> *leftVariables;
  TIntermAggregate *assignList;
  TType derefType;
  int semanticId;
  bool isOutput;
  bool isFlattenRight;
  bool isFlattenLeft;
  bool isSplitRight;
  TIntermSymbol *pTStack_60;
  bool isSplitLeft;
  TIntermSymbol *rightSymbol;
  TIntermSymbol *leftSymbol;
  anon_class_8_1_8991fb9c assignsClipPos;
  anon_class_8_1_8991fb9c aStack_40;
  anon_class_1_0_00000001 getSymbol;
  anon_class_8_1_8991fb9c indexesSplit;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  TSourceLoc *pTStack_20;
  TOperator op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if ((left == (TIntermTyped *)0x0) || (right == (TIntermTyped *)0x0)) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    left_local._4_4_ = op;
    pTStack_20 = loc;
    loc_local = (TSourceLoc *)this;
    iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x1b0))();
    if ((uVar6 & 1) != 0) {
      TIntermediate::setNeedsLegalization
                ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])();
    if (CONCAT44(extraout_var_00,iVar3) != 0) {
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[4])();
      TVar4 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_01,iVar3));
      if (TVar4 == EOpMatrixSwizzle) {
        pHVar7 = (HlslParseContext *)
                 handleAssignToMatrixSwizzle(this,pTStack_20,left_local._4_4_,left,right);
        return (TIntermTyped *)pHVar7;
      }
    }
    leftSymbol = (TIntermSymbol *)this;
    aStack_40.this = this;
    rightSymbol = handleAssign::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)((long)&assignsClipPos.this + 7),left);
    pTStack_60 = handleAssign::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)((long)&assignsClipPos.this + 7),right);
    bVar2 = wasSplit(this,left);
    local_351 = true;
    if (!bVar2) {
      local_351 = handleAssign::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffc0,left);
    }
    semanticId._3_1_ = local_351;
    bVar2 = wasSplit(this,right);
    local_352 = true;
    if (!bVar2) {
      local_352 = handleAssign::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffc0,right);
    }
    semanticId._2_1_ = local_352;
    semanticId._1_1_ = wasFlattened(this,&rightSymbol->super_TIntermTyped);
    semanticId._0_1_ = wasFlattened(this,&pTStack_60->super_TIntermTyped);
    if (((((semanticId._1_1_ & 1) != 0) || ((bool)(byte)semanticId)) ||
        ((semanticId._3_1_ & 1) != 0)) || ((semanticId._2_1_ & 1) != 0)) {
      leftVariables = (TVector<glslang::TVariable_*> *)0x0;
      rightVariables = (TVector<glslang::TVariable_*> *)0x0;
      rhsTempVar = (TVariable *)0x0;
      cloneSymNode = (TIntermSymbol *)0x0;
      pTStack_130 = (TIntermSymbol *)0x0;
      local_134 = 0;
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x128))();
      if ((uVar6 & 1) != 0) {
        iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        this_00 = &TType::getStruct((TType *)CONCAT44(extraout_var_09,iVar3))->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        sVar9 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                          (this_00);
        local_134 = (int)sVar9;
      }
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0xe8))();
      if ((uVar6 & 1) != 0) {
        iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        local_134 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar3) + 0x88))();
      }
      if ((semanticId._1_1_ & 1) != 0) {
        iVar3 = (*(rightSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
        local_148 = CONCAT44(extraout_var_12,iVar3);
        local_140._M_node =
             (_Base_ptr)
             std::
             map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::find(&(this->flattenMap).
                     super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                    ,&local_148);
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
                  ::operator->(&local_140);
        rightVariables = &(ppVar10->second).members;
      }
      if (((byte)semanticId & 1) == 0) {
        if (1 < local_134) {
          iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])();
          if (CONCAT44(extraout_var_14,iVar3) == 0) {
            iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            cloneSymNode = (TIntermSymbol *)
                           makeInternalVariable
                                     (this,"flattenTemp",(TType *)CONCAT44(extraout_var_16,iVar3));
            iVar3 = (*(cloneSymNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xd])()
            ;
            this_01 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar3) + 0x50))()
            ;
            TQualifier::makeTemporary(this_01);
            arrayElement.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)TIntermediate::addSymbol
                                    ((this->super_TParseContextBase).super_TParseVersions.
                                     intermediate,(TVariable *)cloneSymNode,pTStack_20);
            left_00 = leftVariables;
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar12 = TIntermediate::addAssign
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 left_local._4_4_,
                                 (TIntermTyped *)
                                 arrayElement.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,right,pTStack_20);
            leftVariables =
                 (TVector<glslang::TVariable_*> *)
                 TIntermediate::growAggregate
                           (pTVar1,(TIntermNode *)left_00,&pTVar12->super_TIntermNode,pTStack_20);
          }
          else {
            iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])();
            pTStack_130 = (TIntermSymbol *)CONCAT44(extraout_var_15,iVar3);
          }
        }
      }
      else {
        iVar3 = (*(pTStack_60->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])();
        noFlattenRHS = (TIntermTyped *)CONCAT44(extraout_var_13,iVar3);
        local_150._M_node =
             (_Base_ptr)
             std::
             map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
             ::find(&(this->flattenMap).
                     super_map<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>,_glslang::pool_allocator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>_>
                    ,(key_type_conflict2 *)&noFlattenRHS);
        ppVar10 = std::
                  _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
                  ::operator->(&local_150);
        rhsTempVar = (TVariable *)&ppVar10->second;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&rightStorage);
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar3) + 0x58))();
      leftOffsetStart = (uint)*(undefined8 *)(lVar8 + 8) & 0x7f;
      iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar3) + 0x58))();
      rightOffsetStart = (uint)*(undefined8 *)(lVar8 + 8) & 0x7f;
      leftOffset = findSubtreeOffset(this,&left->super_TIntermNode);
      getMember.rightOffsetStart._0_4_ = findSubtreeOffset(this,&right->super_TIntermNode);
      getMember.rightOffsetStart._4_4_ = leftOffset;
      traverse._M_invoker = (_Invoker_type)((long)&semanticId + 3);
      getMember.isSplitLeft = (bool *)((long)&semanticId + 2);
      getMember.this = (HlslParseContext *)&leftOffsetStart;
      getMember.leftStorage = (TStorageQualifier *)&rightOffsetStart;
      getMember.rightStorage = &rightStorage;
      getMember.arrayElement = (vector<int,_std::allocator<int>_> *)pTStack_20;
      getMember.loc = (TSourceLoc *)((long)&getMember.rightOffsetStart + 4);
      getMember.leftOffset = (int *)&rightVariables;
      getMember.leftVariables = (TVector<glslang::TVariable_*> **)&leftOffset;
      getMember.leftOffsetStart = (int *)&getMember.rightOffsetStart;
      getMember.rightOffset = (int *)&rhsTempVar;
      getMember.rightVariables = (TVector<glslang::TVariable_*> **)&rightOffset;
      getMember.isSplitRight = (bool *)this;
      rightOffset = (int)getMember.rightOffsetStart;
      if (cloneSymNode == (TIntermSymbol *)0x0) {
        local_3a0 = (TIntermSymbol *)right;
        if (pTStack_130 != (TIntermSymbol *)0x0) {
          local_3a0 = TIntermediate::addSymbol
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                 pTStack_130);
        }
        local_398 = local_3a0;
      }
      else {
        local_398 = TIntermediate::addSymbol
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                               (TVariable *)cloneSymNode,pTStack_20);
      }
      splitLeft = (TIntermTyped *)((long)&semanticId + 1);
      local_278 = (TStorageQualifier *)&leftOffsetStart;
      local_270 = (bool *)&semanticId;
      local_268 = (TStorageQualifier *)&rightOffsetStart;
      local_260 = (bool *)((long)&semanticId + 3);
      local_258 = (bool *)((long)&semanticId + 2);
      local_250 = (vector<int,_std::allocator<int>_> *)&rightStorage;
      local_248 = (anon_class_104_13_1d5e7770 *)&traverse._M_invoker;
      local_240 = (function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                   *)local_218;
      local_238 = (TIntermAggregate **)&leftVariables;
      local_230 = (TOperator *)((long)&left_local + 4);
      local_228 = pTStack_20;
      local_220 = (anon_class_8_1_8991fb9c *)&leftSymbol;
      local_280 = this;
      std::
      function<void(glslang::TIntermTyped*,glslang::TIntermTyped*,glslang::TIntermTyped*,glslang::TIntermTyped*,bool)>
      ::
      function<glslang::HlslParseContext::handleAssign(glslang::TSourceLoc_const&,glslang::TOperator,glslang::TIntermTyped*,glslang::TIntermTyped*)::__0,void>
                ((function<void(glslang::TIntermTyped*,glslang::TIntermTyped*,glslang::TIntermTyped*,glslang::TIntermTyped*,bool)>
                  *)local_218,(anon_class_112_14_5e0b82b5 *)&splitLeft);
      symNode = local_398;
      splitRight = left;
      if ((semanticId._3_1_ & 1) != 0) {
        bVar2 = handleAssign::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffc0,left);
        if (bVar2) {
          iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])();
          plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_20,iVar3) + 400))();
          plVar11 = (long *)(**(code **)(*plVar11 + 0x60))();
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          lVar13 = (**(code **)(*plVar11 + 0x180))();
          pTVar14 = getSplitNonIoVar(this,lVar13);
          derefType_1.spirvType = (TSpirvType *)TIntermediate::addSymbol(pTVar1,pTVar14,pTStack_20);
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])();
          TVar4 = TIntermOperator::getOp((TIntermOperator *)CONCAT44(extraout_var_21,iVar3));
          base = derefType_1.spirvType;
          iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[8])();
          pTVar12 = (TIntermTyped *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar3) + 0x198))();
          splitRight = TIntermediate::addIndex(pTVar1,TVar4,(TIntermTyped *)base,pTVar12,pTStack_20)
          ;
          type = (TType *)(*(code *)((derefType_1.spirvType)->spirvInst).set._M_dataplus.
                                    super_allocator_type.allocator[2].inUseList)();
          TType::TType((TType *)&symNode_1,type,0,false);
          (*(splitRight->super_TIntermNode)._vptr_TIntermNode[0x1d])(splitRight,&symNode_1);
          TType::~TType((TType *)&symNode_1);
        }
        else {
          iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0xc])();
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar3) + 0x180))();
          pTVar14 = getSplitNonIoVar(this,lVar13);
          splitRight = &TIntermediate::addSymbol(pTVar1,pTVar14,pTStack_20)->super_TIntermTyped;
        }
      }
      if ((semanticId._2_1_ & 1) != 0) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar3 = (*(local_398->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])();
        lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar3) + 0x180))();
        pTVar14 = getSplitNonIoVar(this,lVar13);
        symNode = TIntermediate::addSymbol(pTVar1,pTVar14,pTStack_20);
      }
      std::
      function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
      ::operator()((function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                    *)local_218,left,&local_398->super_TIntermTyped,splitRight,
                   &symNode->super_TIntermTyped,true);
      if (leftVariables == (TVector<glslang::TVariable_*> *)0x0) {
        __assert_fail("assignList != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xc98,
                      "TIntermTyped *glslang::HlslParseContext::handleAssign(const TSourceLoc &, TOperator, TIntermTyped *, TIntermTyped *)"
                     );
      }
      (*(code *)(leftVariables->
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>).
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Tp_alloc_type.allocator[4].alignment)(leftVariables,1);
      this_local = (HlslParseContext *)leftVariables;
      std::
      function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
      ::~function((function<void_(glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_glslang::TIntermTyped_*,_bool)>
                   *)local_218);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&rightStorage);
    }
    else {
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_02,iVar3));
      if (!bVar2) {
        iVar3 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
        bVar2 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_03,iVar3));
        if (!bVar2) {
          bVar2 = handleAssign::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)&leftSymbol,left);
          if (!bVar2) {
            iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x21])();
            right_local = left;
            if (((((uint)(*(ulong *)(CONCAT44(extraout_var_06,iVar3) + 8) >> 7) & 0x1ff) == 0x47) &&
                (uVar5 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x2a])(), (uVar5 & 1) != 0))
               && (uVar5 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x2a])(), (uVar5 & 1) == 0
                  )) {
              iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
              TType::TType((TType *)&assignList,(TType *)CONCAT44(extraout_var_07,iVar3),0,false);
              pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
              index = TIntermediate::addConstantUnion
                                ((this->super_TParseContextBase).super_TParseVersions.intermediate,0
                                 ,pTStack_20,false);
              right_local = TIntermediate::addIndex
                                      (pTVar1,EOpIndexDirect,left,&index->super_TIntermTyped,
                                       pTStack_20);
              (*(right_local->super_TIntermNode)._vptr_TIntermNode[0x1d])(right_local,&assignList);
              TType::~TType((TType *)&assignList);
            }
            pHVar7 = (HlslParseContext *)
                     TIntermediate::addAssign
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                left_local._4_4_,right_local,right,pTStack_20);
            return (TIntermTyped *)pHVar7;
          }
          pHVar7 = (HlslParseContext *)assignPosition(this,pTStack_20,left_local._4_4_,left,right);
          return (TIntermTyped *)pHVar7;
        }
      }
      iVar3 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      bVar2 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_04,iVar3));
      local_360 = right;
      if (bVar2) {
        local_360 = left;
      }
      iVar3 = (*(local_360->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x58))();
      derefType.spirvType._4_4_ = (uint)*(undefined8 *)(lVar8 + 0x1c) & 0xfff;
      this_local = (HlslParseContext *)
                   assignClipCullDistance
                             (this,pTStack_20,left_local._4_4_,derefType.spirvType._4_4_,left,right)
      ;
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::handleAssign(const TSourceLoc& loc, TOperator op, TIntermTyped* left,
                                             TIntermTyped* right)
{
    if (left == nullptr || right == nullptr)
        return nullptr;

    // writing to opaques will require fixing transforms
    if (left->getType().containsOpaque())
        intermediate.setNeedsLegalization();

    if (left->getAsOperator() && left->getAsOperator()->getOp() == EOpMatrixSwizzle)
        return handleAssignToMatrixSwizzle(loc, op, left, right);

    // Return true if the given node is an index operation into a split variable.
    const auto indexesSplit = [this](const TIntermTyped* node) -> bool {
        const TIntermBinary* binaryNode = node->getAsBinaryNode();

        if (binaryNode == nullptr)
            return false;

        return (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect) &&
               wasSplit(binaryNode->getLeft());
    };

    // Return symbol if node is symbol or index ref
    const auto getSymbol = [](const TIntermTyped* node) -> const TIntermSymbol* {
        const TIntermSymbol* symbolNode = node->getAsSymbolNode();
        if (symbolNode != nullptr)
            return symbolNode;

        const TIntermBinary* binaryNode = node->getAsBinaryNode();
        if (binaryNode != nullptr && (binaryNode->getOp() == EOpIndexDirect || binaryNode->getOp() == EOpIndexIndirect))
            return binaryNode->getLeft()->getAsSymbolNode();

        return nullptr;
    };

    // Return true if this stage assigns clip position with potentially inverted Y
    const auto assignsClipPos = [this](const TIntermTyped* node) -> bool {
        return node->getType().getQualifier().builtIn == EbvPosition &&
               (language == EShLangVertex || language == EShLangGeometry || language == EShLangTessEvaluation);
    };

    const TIntermSymbol* leftSymbol = getSymbol(left);
    const TIntermSymbol* rightSymbol = getSymbol(right);

    const bool isSplitLeft    = wasSplit(left) || indexesSplit(left);
    const bool isSplitRight   = wasSplit(right) || indexesSplit(right);

    const bool isFlattenLeft  = wasFlattened(leftSymbol);
    const bool isFlattenRight = wasFlattened(rightSymbol);

    // OK to do a single assign if neither side is split or flattened.  Otherwise,
    // fall through to a member-wise copy.
    if (!isFlattenLeft && !isFlattenRight && !isSplitLeft && !isSplitRight) {
        // Clip and cull distance requires more processing.  See comment above assignClipCullDistance.
        if (isClipOrCullDistance(left->getType()) || isClipOrCullDistance(right->getType())) {
            const bool isOutput = isClipOrCullDistance(left->getType());

            const int semanticId = (isOutput ? left : right)->getType().getQualifier().layoutLocation;
            return assignClipCullDistance(loc, op, semanticId, left, right);
        } else if (assignsClipPos(left)) {
            // Position can require special handling: see comment above assignPosition
            return assignPosition(loc, op, left, right);
        } else if (left->getQualifier().builtIn == EbvSampleMask) {
            // Certain builtins are required to be arrayed outputs in SPIR-V, but may internally be scalars
            // in the shader.  Copy the scalar RHS into the LHS array element zero, if that happens.
            if (left->isArray() && !right->isArray()) {
                const TType derefType(left->getType(), 0);
                left = intermediate.addIndex(EOpIndexDirect, left, intermediate.addConstantUnion(0, loc), loc);
                left->setType(derefType);
                // Fall through to add assign.
            }
        }

        return intermediate.addAssign(op, left, right, loc);
    }

    TIntermAggregate* assignList = nullptr;
    const TVector<TVariable*>* leftVariables = nullptr;
    const TVector<TVariable*>* rightVariables = nullptr;

    // A temporary to store the right node's value, so we don't keep indirecting into it
    // if it's not a simple symbol.
    TVariable* rhsTempVar = nullptr;

    // If the RHS is a simple symbol node, we'll copy it for each member.
    TIntermSymbol* cloneSymNode = nullptr;

    int memberCount = 0;

    // Track how many items there are to copy.
    if (left->getType().isStruct())
        memberCount = (int)left->getType().getStruct()->size();
    if (left->getType().isArray())
        memberCount = left->getType().getCumulativeArraySize();

    if (isFlattenLeft)
        leftVariables = &flattenMap.find(leftSymbol->getId())->second.members;

    if (isFlattenRight) {
        rightVariables = &flattenMap.find(rightSymbol->getId())->second.members;
    } else {
        // The RHS is not flattened.  There are several cases:
        // 1. 1 item to copy:  Use the RHS directly.
        // 2. >1 item, simple symbol RHS: we'll create a new TIntermSymbol node for each, but no assign to temp.
        // 3. >1 item, complex RHS: assign it to a new temp variable, and create a TIntermSymbol for each member.

        if (memberCount <= 1) {
            // case 1: we'll use the symbol directly below.  Nothing to do.
        } else {
            if (right->getAsSymbolNode() != nullptr) {
                // case 2: we'll copy the symbol per iteration below.
                cloneSymNode = right->getAsSymbolNode();
            } else {
                // case 3: assign to a temp, and indirect into that.
                rhsTempVar = makeInternalVariable("flattenTemp", right->getType());
                rhsTempVar->getWritableType().getQualifier().makeTemporary();
                TIntermTyped* noFlattenRHS = intermediate.addSymbol(*rhsTempVar, loc);

                // Add this to the aggregate being built.
                assignList = intermediate.growAggregate(assignList,
                                                        intermediate.addAssign(op, noFlattenRHS, right, loc), loc);
            }
        }
    }

    // When dealing with split arrayed structures of built-ins, the arrayness is moved to the extracted built-in
    // variables, which is awkward when copying between split and unsplit structures.  This variable tracks
    // array indirections so they can be percolated from outer structs to inner variables.
    std::vector <int> arrayElement;

    TStorageQualifier leftStorage = left->getType().getQualifier().storage;
    TStorageQualifier rightStorage = right->getType().getQualifier().storage;

    int leftOffsetStart = findSubtreeOffset(*left);
    int rightOffsetStart = findSubtreeOffset(*right);
    int leftOffset = leftOffsetStart;
    int rightOffset = rightOffsetStart;

    const auto getMember = [&](bool isLeft, const TType& type, int member, TIntermTyped* splitNode, int splitMember,
                               bool flattened)
                           -> TIntermTyped * {
        const bool split     = isLeft ? isSplitLeft   : isSplitRight;

        TIntermTyped* subTree;
        const TType derefType(type, member);
        const TVariable* builtInVar = nullptr;
        if ((flattened || split) && derefType.isBuiltIn()) {
            auto splitPair = splitBuiltIns.find(HlslParseContext::tInterstageIoData(
                                                   derefType.getQualifier().builtIn,
                                                   isLeft ? leftStorage : rightStorage));
            if (splitPair != splitBuiltIns.end())
                builtInVar = splitPair->second;
        }
        if (builtInVar != nullptr) {
            // copy from interstage IO built-in if needed
            subTree = intermediate.addSymbol(*builtInVar);

            if (subTree->getType().isArray()) {
                // Arrayness of builtIn symbols isn't handled by the normal recursion:
                // it's been extracted and moved to the built-in.
                if (!arrayElement.empty()) {
                    const TType splitDerefType(subTree->getType(), arrayElement.back());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.back(), loc), loc);
                    subTree->setType(splitDerefType);
                } else if (splitNode->getAsOperator() != nullptr && (splitNode->getAsOperator()->getOp() == EOpIndexIndirect)) {
                    // This might also be a stage with arrayed outputs, in which case there's an index
                    // operation we should transfer to the output builtin.

                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else if (flattened && !shouldFlatten(derefType, isLeft ? leftStorage : rightStorage, false)) {
            if (isLeft) {
                // offset will cycle through variables for arrayed io
                if (leftOffset >= static_cast<int>(leftVariables->size()))
                    leftOffset = leftOffsetStart;
                subTree = intermediate.addSymbol(*(*leftVariables)[leftOffset++]);
            } else {
                // offset will cycle through variables for arrayed io
                if (rightOffset >= static_cast<int>(rightVariables->size()))
                    rightOffset = rightOffsetStart;
                subTree = intermediate.addSymbol(*(*rightVariables)[rightOffset++]);
            }

            // arrayed io
            if (subTree->getType().isArray()) {
                if (!arrayElement.empty()) {
                    const TType derefType(subTree->getType(), arrayElement.front());
                    subTree = intermediate.addIndex(EOpIndexDirect, subTree,
                                                    intermediate.addConstantUnion(arrayElement.front(), loc), loc);
                    subTree->setType(derefType);
                } else {
                    // There's an index operation we should transfer to the output builtin.
                    assert(splitNode->getAsOperator() != nullptr &&
                           splitNode->getAsOperator()->getOp() == EOpIndexIndirect);
                    const TType splitDerefType(subTree->getType(), 0);
                    subTree = intermediate.addIndex(splitNode->getAsOperator()->getOp(), subTree,
                                                    splitNode->getAsBinaryNode()->getRight(), loc);
                    subTree->setType(splitDerefType);
                }
            }
        } else {
            // Index operator if it's an aggregate, else EOpNull
            const TOperator accessOp = type.isArray()  ? EOpIndexDirect
                                     : type.isStruct() ? EOpIndexDirectStruct
                                     : EOpNull;
            if (accessOp == EOpNull) {
                subTree = splitNode;
            } else {
                subTree = intermediate.addIndex(accessOp, splitNode, intermediate.addConstantUnion(splitMember, loc),
                                                loc);
                const TType splitDerefType(splitNode->getType(), splitMember);
                subTree->setType(splitDerefType);
            }
        }

        return subTree;
    };

    // Use the proper RHS node: a new symbol from a TVariable, copy
    // of an TIntermSymbol node, or sometimes the right node directly.
    right = rhsTempVar != nullptr   ? intermediate.addSymbol(*rhsTempVar, loc) :
            cloneSymNode != nullptr ? intermediate.addSymbol(*cloneSymNode) :
            right;

    // Cannot use auto here, because this is recursive, and auto can't work out the type without seeing the
    // whole thing.  So, we'll resort to an explicit type via std::function.
    const std::function<void(TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                             bool topLevel)>
    traverse = [&](TIntermTyped* left, TIntermTyped* right, TIntermTyped* splitLeft, TIntermTyped* splitRight,
                   bool topLevel) -> void {
        // If we get here, we are assigning to or from a whole array or struct that must be
        // flattened, so have to do member-by-member assignment:

        bool shouldFlattenSubsetLeft = isFlattenLeft && shouldFlatten(left->getType(), leftStorage, topLevel);
        bool shouldFlattenSubsetRight = isFlattenRight && shouldFlatten(right->getType(), rightStorage, topLevel);

        if ((left->getType().isArray() || right->getType().isArray()) &&
              (shouldFlattenSubsetLeft  || isSplitLeft ||
               shouldFlattenSubsetRight || isSplitRight)) {
            const int elementsL = left->getType().isArray()  ? left->getType().getOuterArraySize()  : 1;
            const int elementsR = right->getType().isArray() ? right->getType().getOuterArraySize() : 1;

            // The arrays might not be the same size,
            // e.g., if the size has been forced for EbvTessLevelInner/Outer.
            const int elementsToCopy = std::min(elementsL, elementsR);

            // array case
            for (int element = 0; element < elementsToCopy; ++element) {
                arrayElement.push_back(element);

                // Add a new AST symbol node if we have a temp variable holding a complex RHS.
                TIntermTyped* subLeft  = getMember(true,  left->getType(),  element, left, element,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), element, right, element,
                                                   shouldFlattenSubsetRight);

                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  element, splitLeft,
                                                                       element, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), element, splitRight,
                                                                       element, shouldFlattenSubsetRight)
                                                           : subRight;

                traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);

                arrayElement.pop_back();
            }
        } else if (left->getType().isStruct() && (shouldFlattenSubsetLeft  || isSplitLeft ||
                                                  shouldFlattenSubsetRight || isSplitRight)) {
            // struct case
            const auto& membersL = *left->getType().getStruct();
            const auto& membersR = *right->getType().getStruct();

            // These track the members in the split structures corresponding to the same in the unsplit structures,
            // which we traverse in parallel.
            int memberL = 0;
            int memberR = 0;

            // Handle empty structure assignment
            if (int(membersL.size()) == 0 && int(membersR.size()) == 0)
                assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);

            for (int member = 0; member < int(membersL.size()); ++member) {
                const TType& typeL = *membersL[member].type;
                const TType& typeR = *membersR[member].type;

                TIntermTyped* subLeft  = getMember(true,  left->getType(), member, left, member,
                                                   shouldFlattenSubsetLeft);
                TIntermTyped* subRight = getMember(false, right->getType(), member, right, member,
                                                   shouldFlattenSubsetRight);

                // If there is no splitting, use the same values to avoid inefficiency.
                TIntermTyped* subSplitLeft =  isSplitLeft  ? getMember(true,  left->getType(),  member, splitLeft,
                                                                       memberL, shouldFlattenSubsetLeft)
                                                           : subLeft;
                TIntermTyped* subSplitRight = isSplitRight ? getMember(false, right->getType(), member, splitRight,
                                                                       memberR, shouldFlattenSubsetRight)
                                                           : subRight;

                if (isClipOrCullDistance(subSplitLeft->getType()) || isClipOrCullDistance(subSplitRight->getType())) {
                    // Clip and cull distance built-in assignment is complex in its own right, and is handled in
                    // a separate function dedicated to that task.  See comment above assignClipCullDistance;

                    const bool isOutput = isClipOrCullDistance(subSplitLeft->getType());

                    // Since all clip/cull semantics boil down to the same built-in type, we need to get the
                    // semantic ID from the dereferenced type's layout location, to avoid an N-1 mapping.
                    const TType derefType((isOutput ? left : right)->getType(), member);
                    const int semanticId = derefType.getQualifier().layoutLocation;

                    TIntermAggregate* clipCullAssign = assignClipCullDistance(loc, op, semanticId,
                                                                              subSplitLeft, subSplitRight);

                    assignList = intermediate.growAggregate(assignList, clipCullAssign, loc);
                } else if (subSplitRight->getType().getQualifier().builtIn == EbvFragCoord) {
                    // FragCoord can require special handling: see comment above assignFromFragCoord
                    TIntermTyped* fragCoordAssign = assignFromFragCoord(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, fragCoordAssign, loc);
                } else if (assignsClipPos(subSplitLeft)) {
                    // Position can require special handling: see comment above assignPosition
                    TIntermTyped* positionAssign = assignPosition(loc, op, subSplitLeft, subSplitRight);
                    assignList = intermediate.growAggregate(assignList, positionAssign, loc);
                } else if (!shouldFlattenSubsetLeft && !shouldFlattenSubsetRight &&
                           !typeL.containsBuiltIn() && !typeR.containsBuiltIn()) {
                    // If this is the final flattening (no nested types below to flatten)
                    // we'll copy the member, else recurse into the type hierarchy.
                    // However, if splitting the struct, that means we can copy a whole
                    // subtree here IFF it does not itself contain any interstage built-in
                    // IO variables, so we only have to recurse into it if there's something
                    // for splitting to do.  That can save a lot of AST verbosity for
                    // a bunch of memberwise copies.

                    assignList = intermediate.growAggregate(assignList,
                                                            intermediate.addAssign(op, subSplitLeft, subSplitRight, loc),
                                                            loc);
                } else {
                    traverse(subLeft, subRight, subSplitLeft, subSplitRight, false);
                }

                memberL += (typeL.isBuiltIn() ? 0 : 1);
                memberR += (typeR.isBuiltIn() ? 0 : 1);
            }
        } else {
            // Member copy
            assignList = intermediate.growAggregate(assignList, intermediate.addAssign(op, left, right, loc), loc);
        }

    };

    TIntermTyped* splitLeft  = left;
    TIntermTyped* splitRight = right;

    // If either left or right was a split structure, we must read or write it, but still have to
    // parallel-recurse through the unsplit structure to identify the built-in IO vars.
    // The left can be either a symbol, or an index into a symbol (e.g, array reference)
    if (isSplitLeft) {
        if (indexesSplit(left)) {
            // Index case: Refer to the indexed symbol, if the left is an index operator.
            const TIntermSymbol* symNode = left->getAsBinaryNode()->getLeft()->getAsSymbolNode();

            TIntermTyped* splitLeftNonIo = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);

            splitLeft = intermediate.addIndex(left->getAsBinaryNode()->getOp(), splitLeftNonIo,
                                              left->getAsBinaryNode()->getRight(), loc);

            const TType derefType(splitLeftNonIo->getType(), 0);
            splitLeft->setType(derefType);
        } else {
            // Symbol case: otherwise, if not indexed, we have the symbol directly.
            const TIntermSymbol* symNode = left->getAsSymbolNode();
            splitLeft = intermediate.addSymbol(*getSplitNonIoVar(symNode->getId()), loc);
        }
    }

    if (isSplitRight)
        splitRight = intermediate.addSymbol(*getSplitNonIoVar(right->getAsSymbolNode()->getId()), loc);

    // This makes the whole assignment, recursing through subtypes as needed.
    traverse(left, right, splitLeft, splitRight, true);

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}